

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_setb(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  ulong uVar1;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  uVar1 = (ulong)(ctx->opcode >> 0xf & 0x38);
  tcg_gen_setcondi_i32_ppc64(tcg_ctx,TCG_COND_GEU,ret,*(TCGv_i32 *)((long)cpu_crf + uVar1),4);
  tcg_gen_movi_i32(tcg_ctx,ret_00,8);
  tcg_gen_movi_i32(tcg_ctx,ret_01,-1);
  tcg_gen_movcond_i32_ppc64
            (tcg_ctx,TCG_COND_GEU,ret,*(TCGv_i32 *)((long)cpu_crf + uVar1),ret_00,ret_01,ret);
  tcg_gen_ext_i32_i64_ppc64
            (tcg_ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_setb(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t8 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 tm1 = tcg_temp_new_i32(tcg_ctx);
    int crf = crfS(ctx->opcode);

    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], 4);
    tcg_gen_movi_i32(tcg_ctx, t8, 8);
    tcg_gen_movi_i32(tcg_ctx, tm1, -1);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], t8, tm1, t0);
    tcg_gen_ext_i32_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t8);
    tcg_temp_free_i32(tcg_ctx, tm1);
}